

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

void readHosts(string *filePath,Hosts *hosts)

{
  int port_00;
  istream *piVar1;
  int port;
  Hosts *local_368;
  string host;
  string displayName;
  string userName;
  string local_300;
  string local_2e0;
  string local_2c0;
  Host local_2a0;
  ifstream ifs;
  
  local_368 = hosts;
  std::ifstream::ifstream(&ifs,(string *)filePath,_S_in);
  displayName._M_dataplus._M_p = (pointer)&displayName.field_2;
  displayName._M_string_length = 0;
  host._M_dataplus._M_p = (pointer)&host.field_2;
  host._M_string_length = 0;
  displayName.field_2._M_local_buf[0] = '\0';
  host.field_2._M_local_buf[0] = '\0';
  userName._M_dataplus._M_p = (pointer)&userName.field_2;
  userName._M_string_length = 0;
  userName.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::operator>>((istream *)&ifs,(string *)&displayName);
    piVar1 = std::operator>>(piVar1,(string *)&host);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&port);
    piVar1 = std::operator>>(piVar1,(string *)&userName);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::string((string *)&local_2c0,(string *)&displayName);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&host);
    port_00 = port;
    std::__cxx11::string::string((string *)&local_300,(string *)&userName);
    Host::Host(&local_2a0,&local_2c0,&local_2e0,port_00,&local_300);
    std::vector<Host,_std::allocator<Host>_>::emplace_back<Host>(local_368,&local_2a0);
    Host::~Host(&local_2a0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  std::__cxx11::string::~string((string *)&userName);
  std::__cxx11::string::~string((string *)&host);
  std::__cxx11::string::~string((string *)&displayName);
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

void readHosts(std::string filePath, Hosts &hosts) {
    std::ifstream ifs(filePath, std::ifstream::in);
    std::string displayName, host, userName;
    int port;
    while (ifs >> displayName >> host >> port >> userName) {
        hosts.emplace_back(Host(displayName, host, port, userName));
    }
}